

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

void analyseModelBounds(HighsLogOptions *log_options,char *message,HighsInt numBd,
                       vector<double,_std::allocator<double>_> *lower,
                       vector<double,_std::allocator<double>_> *upper)

{
  double dVar1;
  bool bVar2;
  const_reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  HighsLogOptions *in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  HighsInt ix;
  HighsInt numFx;
  HighsInt numBx;
  HighsInt numUb;
  HighsInt numLb;
  HighsInt numFr;
  int local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  if (in_EDX != 0) {
    local_2c = 0;
    local_30 = 0;
    local_34 = 0;
    local_38 = 0;
    local_3c = 0;
    for (local_40 = 0; local_40 < (int)in_EDX; local_40 = local_40 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)local_40);
      bVar2 = highs_isInfinity(-*pvVar3);
      if (bVar2) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)local_40);
        bVar2 = highs_isInfinity(*pvVar3);
        if (bVar2) {
          local_2c = local_2c + 1;
        }
        else {
          local_34 = local_34 + 1;
        }
      }
      else {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)local_40);
        bVar2 = highs_isInfinity(*pvVar3);
        if (bVar2) {
          local_30 = local_30 + 1;
        }
        else {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)local_40);
          dVar1 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,(long)local_40);
          if (*pvVar3 <= dVar1) {
            local_3c = local_3c + 1;
          }
          else {
            local_38 = local_38 + 1;
          }
        }
      }
    }
    highsLogDev(in_RDI,kInfo,"Analysing %d %s bounds\n",(ulong)in_EDX,in_RSI);
    if (0 < (int)local_2c) {
      highsLogDev(in_RDI,kInfo,"   Free:  %7d (%3d%%)\n",(ulong)local_2c,
                  (long)(int)(local_2c * 100) / (long)(int)in_EDX & 0xffffffff);
    }
    if (0 < (int)local_30) {
      highsLogDev(in_RDI,kInfo,"   LB:    %7d (%3d%%)\n",(ulong)local_30,
                  (long)(int)(local_30 * 100) / (long)(int)in_EDX & 0xffffffff);
    }
    if (0 < (int)local_34) {
      highsLogDev(in_RDI,kInfo,"   UB:    %7d (%3d%%)\n",(ulong)local_34,
                  (long)(int)(local_34 * 100) / (long)(int)in_EDX & 0xffffffff);
    }
    if (0 < (int)local_38) {
      highsLogDev(in_RDI,kInfo,"   Boxed: %7d (%3d%%)\n",(ulong)local_38,
                  (long)(int)(local_38 * 100) / (long)(int)in_EDX & 0xffffffff);
    }
    if (0 < (int)local_3c) {
      highsLogDev(in_RDI,kInfo,"   Fixed: %7d (%3d%%)\n",(ulong)local_3c,
                  (long)(int)(local_3c * 100) / (long)(int)in_EDX & 0xffffffff);
    }
    highsLogDev(in_RDI,kInfo,"grep_CharMl,%s,Free,LB,UB,Boxed,Fixed\n",in_RSI);
    highsLogDev(in_RDI,kInfo,"grep_CharMl,%d,%d,%d,%d,%d,%d\n",(ulong)in_EDX,(ulong)local_2c,
                (ulong)local_30,local_34,local_38,local_3c);
  }
  return;
}

Assistant:

void analyseModelBounds(const HighsLogOptions& log_options, const char* message,
                        HighsInt numBd, const std::vector<double>& lower,
                        const std::vector<double>& upper) {
  if (numBd == 0) return;
  HighsInt numFr = 0;
  HighsInt numLb = 0;
  HighsInt numUb = 0;
  HighsInt numBx = 0;
  HighsInt numFx = 0;
  for (HighsInt ix = 0; ix < numBd; ix++) {
    if (highs_isInfinity(-lower[ix])) {
      // Infinite lower bound
      if (highs_isInfinity(upper[ix])) {
        // Infinite lower bound and infinite upper bound: Fr
        numFr++;
      } else {
        // Infinite lower bound and   finite upper bound: Ub
        numUb++;
      }
    } else {
      // Finite lower bound
      if (highs_isInfinity(upper[ix])) {
        // Finite lower bound and infinite upper bound: Lb
        numLb++;
      } else {
        // Finite lower bound and   finite upper bound:
        if (lower[ix] < upper[ix]) {
          // Distinct finite bounds: Bx
          numBx++;
        } else {
          // Equal finite bounds: Fx
          numFx++;
        }
      }
    }
  }
  highsLogDev(log_options, HighsLogType::kInfo,
              "Analysing %" HIGHSINT_FORMAT " %s bounds\n", numBd, message);
  if (numFr > 0)
    highsLogDev(log_options, HighsLogType::kInfo,
                "   Free:  %7" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT "%%)\n",
                numFr, (100 * numFr) / numBd);
  if (numLb > 0)
    highsLogDev(log_options, HighsLogType::kInfo,
                "   LB:    %7" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT "%%)\n",
                numLb, (100 * numLb) / numBd);
  if (numUb > 0)
    highsLogDev(log_options, HighsLogType::kInfo,
                "   UB:    %7" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT "%%)\n",
                numUb, (100 * numUb) / numBd);
  if (numBx > 0)
    highsLogDev(log_options, HighsLogType::kInfo,
                "   Boxed: %7" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT "%%)\n",
                numBx, (100 * numBx) / numBd);
  if (numFx > 0)
    highsLogDev(log_options, HighsLogType::kInfo,
                "   Fixed: %7" HIGHSINT_FORMAT " (%3" HIGHSINT_FORMAT "%%)\n",
                numFx, (100 * numFx) / numBd);
  highsLogDev(log_options, HighsLogType::kInfo,
              "grep_CharMl,%s,Free,LB,UB,Boxed,Fixed\n", message);
  highsLogDev(log_options, HighsLogType::kInfo,
              "grep_CharMl,%" HIGHSINT_FORMAT ",%" HIGHSINT_FORMAT
              ",%" HIGHSINT_FORMAT ",%" HIGHSINT_FORMAT ",%" HIGHSINT_FORMAT
              ",%" HIGHSINT_FORMAT "\n",
              numBd, numFr, numLb, numUb, numBx, numFx);
}